

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O0

void __thiscall adios2::query::RangeTree::Print(RangeTree *this)

{
  bool bVar1;
  RangeTree *this_00;
  long in_RDI;
  RangeTree node;
  iterator __end2_1;
  iterator __begin2_1;
  vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_> *__range2_1;
  Range leaf;
  iterator __end2;
  iterator __begin2;
  vector<adios2::query::Range,_std::allocator<adios2::query::Range>_> *__range2;
  Range *in_stack_ffffffffffffff38;
  RangeTree *in_stack_ffffffffffffff40;
  RangeTree *in_stack_ffffffffffffff58;
  RangeTree *in_stack_ffffffffffffff60;
  __normal_iterator<adios2::query::RangeTree_*,_std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>_>
  local_68;
  long local_60;
  Range *local_20;
  __normal_iterator<adios2::query::Range_*,_std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>_>
  local_18;
  
  this_00 = (RangeTree *)(in_RDI + 8);
  local_18._M_current =
       (Range *)std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::begin
                          (in_stack_ffffffffffffff38);
  local_20 = (Range *)std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::end
                                ((vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>
                                  *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<adios2::query::Range_*,_std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<adios2::query::Range_*,_std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<adios2::query::Range_*,_std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>_>
    ::operator*(&local_18);
    Range::Range((Range *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Range::Print((Range *)in_stack_ffffffffffffff40);
    Range::~Range((Range *)0xd2dec8);
    __gnu_cxx::
    __normal_iterator<adios2::query::Range_*,_std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>_>
    ::operator++(&local_18);
  }
  local_60 = in_RDI + 0x20;
  local_68._M_current =
       (RangeTree *)
       std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::begin
                 ((vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_> *)
                  in_stack_ffffffffffffff38);
  std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::end
            ((vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_> *)
             in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<adios2::query::RangeTree_*,_std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<adios2::query::RangeTree_*,_std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<adios2::query::RangeTree_*,_std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>_>
    ::operator*(&local_68);
    in_stack_ffffffffffffff40 = (RangeTree *)&stack0xffffffffffffff58;
    RangeTree(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Print(this_00);
    ~RangeTree(in_stack_ffffffffffffff40);
    __gnu_cxx::
    __normal_iterator<adios2::query::RangeTree_*,_std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>_>
    ::operator++(&local_68);
  }
  return;
}

Assistant:

void Print()
    {
        for (auto leaf : m_Leaves)
            leaf.Print();
        for (auto node : m_SubNodes)
            node.Print();
    }